

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GamepadInputHandler_glfw.cpp
# Opt level: O2

void __thiscall GamepadInputHandler::added(GamepadInputHandler *this,GLFWwindow *window)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  string local_40 [39];
  allocator local_19;
  
  iVar2 = glfwJoystickPresent((uint)this->_gamepadIndex);
  bVar1 = this->_gamepadIndex;
  if (iVar2 == 0) {
    pcVar3 = "GLFW joystick number %u doesn\'t exist!";
  }
  else {
    iVar2 = glfwJoystickIsGamepad((uint)bVar1);
    if (iVar2 != 0) {
      pcVar3 = glfwGetGamepadName((uint)this->_gamepadIndex);
      std::__cxx11::string::string(local_40,pcVar3,&local_19);
      std::__cxx11::string::operator=((string *)&this->_gamepadName,local_40);
      std::__cxx11::string::~string(local_40);
      printf("Gamepad added: %u - %s",(ulong)this->_gamepadIndex,
             (this->_gamepadName)._M_dataplus._M_p);
      putchar(10);
      fflush(_stdout);
      return;
    }
    bVar1 = this->_gamepadIndex;
    pcVar3 = "GLFW joystick number %u isn\'t a gamepad!";
  }
  printf(pcVar3,(ulong)bVar1);
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void GamepadInputHandler::added(GLFWwindow *window) {
    // Check if the gamepad exists
    if (!glfwJoystickPresent(_gamepadIndex)) {
        DEBUG_PRINTLN("GLFW joystick number %u doesn't exist!", _gamepadIndex);
        return;
    }

    // Make sure it's actually a gamepad
    if(!glfwJoystickIsGamepad(_gamepadIndex)) {
        DEBUG_PRINTLN("GLFW joystick number %u isn't a gamepad!", _gamepadIndex);
        return;
    }

    // Print the gamepad name
    _gamepadName = std::string(glfwGetGamepadName(_gamepadIndex));
    DEBUG_PRINTLN("Gamepad added: %u - %s", _gamepadIndex, _gamepadName.c_str());
}